

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O3

bool __thiscall
crnlib::mipmapped_texture::write_ktx(mipmapped_texture *this,data_stream_serializer *serializer)

{
  pixel_format pVar1;
  int iVar2;
  int iVar3;
  vector<crnlib::mip_level_*> *pvVar4;
  int *piVar5;
  long lVar6;
  bool bVar7;
  texture_type tVar8;
  uint uVar9;
  size_t sVar10;
  void *p;
  uint uVar11;
  undefined8 uVar12;
  ulong uVar13;
  uint32 ogl_internal_fmt;
  int iVar14;
  uint32 ogl_type;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  uint32 ogl_fmt;
  char *pcVar18;
  ulong uVar19;
  vector<unsigned_char> tmp;
  dynamic_string ktx_orient_str;
  dynamic_string fourcc_str;
  pixel_packer packer;
  ktx_texture kt;
  elemental_vector local_148;
  ulong local_130;
  dynamic_string *local_128;
  data_stream_serializer *local_120;
  ulong local_118;
  long local_110;
  dynamic_string local_108;
  dynamic_string local_f8;
  pixel_packer local_e8;
  ktx_texture local_a0;
  
  local_128 = &this->m_last_error;
  if (this->m_width == 0) {
    dynamic_string::set(local_128,"Nothing to write",0xffffffff);
    uVar9 = 0;
    goto LAB_00131a0f;
  }
  local_120 = serializer;
  dynamic_string::set(local_128,"write_ktx() failed",0xffffffff);
  local_e8.m_comp_max[2] = 0;
  local_e8.m_comp_max[3] = 0;
  local_e8.m_rgb_is_luma = false;
  local_e8._57_3_ = 0;
  local_e8.m_comp_ofs[2] = 0;
  local_e8.m_comp_ofs[3] = 0;
  local_e8.m_comp_max[0] = 0;
  local_e8.m_comp_max[1] = 0;
  local_e8.m_comp_size[2] = 0;
  local_e8.m_comp_size[3] = 0;
  local_e8.m_comp_ofs[0] = 0;
  local_e8.m_comp_ofs[1] = 0;
  local_e8.m_pixel_stride = 0;
  local_e8.m_num_comps = 0;
  local_e8.m_comp_size[0] = 0;
  local_e8.m_comp_size[1] = 0;
  if (((this->m_faces).m_size == 0) ||
     ((*((this->m_faces).m_p)->m_p)->m_pDXTImage == (dxt_image *)0x0)) {
    pVar1 = this->m_format;
    uVar9 = 0;
    if ((int)pVar1 < 0x41787878) {
      if (pVar1 == PIXEL_FMT_A8R8G8B8) {
        pixel_packer::init(&local_e8,(EVP_PKEY_CTX *)"R8G8B8A8");
        ogl_internal_fmt = 0x8058;
        ogl_fmt = 0x1908;
      }
      else {
        if (pVar1 != PIXEL_FMT_A8L8) goto LAB_00131a0f;
        pixel_packer::init(&local_e8,(EVP_PKEY_CTX *)"Y8A8");
        ogl_internal_fmt = 0x8045;
        ogl_fmt = 0x190a;
      }
    }
    else if (pVar1 == PIXEL_FMT_A8) {
      pixel_packer::init(&local_e8,(EVP_PKEY_CTX *)0x1ab6ca);
      ogl_internal_fmt = 0x803c;
      ogl_fmt = 0x1906;
    }
    else if (pVar1 == PIXEL_FMT_L8) {
      pixel_packer::init(&local_e8,(EVP_PKEY_CTX *)"G8");
      ogl_internal_fmt = 0x8040;
      ogl_fmt = 0x1909;
    }
    else {
      if (pVar1 != PIXEL_FMT_R8G8B8) goto LAB_00131a0f;
      pixel_packer::init(&local_e8,(EVP_PKEY_CTX *)0x1abdc8);
      ogl_internal_fmt = 0x8051;
      ogl_fmt = 0x1907;
    }
    ogl_type = 0x1401;
  }
  else {
    pVar1 = this->m_format;
    ogl_type = 0;
    uVar9 = 0;
    if ((int)pVar1 < 0x41315844) {
      if ((int)pVar1 < 0x32495441) {
        if ((int)pVar1 < 0x31545844) {
          if (pVar1 == PIXEL_FMT_ETC1) {
LAB_00131675:
            ogl_internal_fmt = 0x8d64;
          }
          else {
            if (pVar1 != PIXEL_FMT_DXT5A) goto LAB_00131a0f;
            ogl_internal_fmt = 0x8c70;
          }
        }
        else {
          ogl_internal_fmt = 0x83f0;
          if (pVar1 != PIXEL_FMT_DXT1) {
            if (pVar1 != PIXEL_FMT_ETC2) goto LAB_00131a0f;
            ogl_internal_fmt = 0x9274;
          }
        }
      }
      else {
        if ((int)pVar1 < 0x33545844) {
          if (pVar1 == PIXEL_FMT_3DC) {
LAB_00131683:
            ogl_internal_fmt = 0x8dbe;
            goto LAB_0013168f;
          }
          if (pVar1 != PIXEL_FMT_DXT2) goto LAB_00131a0f;
        }
        else if (pVar1 != PIXEL_FMT_DXT3) {
          if ((pVar1 != PIXEL_FMT_DXT4) && (uVar9 = ogl_type, pVar1 != PIXEL_FMT_DXT5))
          goto LAB_00131a0f;
          goto LAB_0013167c;
        }
        ogl_internal_fmt = 0x83f2;
      }
    }
    else {
      if ((int)pVar1 < 0x52784778) {
        if ((int)pVar1 < 0x52424741) {
          if (pVar1 != PIXEL_FMT_DXT1A) {
            if (pVar1 != PIXEL_FMT_ETC2A) goto LAB_00131a0f;
            goto LAB_00131612;
          }
          ogl_internal_fmt = 0x83f1;
          goto LAB_0013168f;
        }
        if ((pVar1 != PIXEL_FMT_DXT5_AGBR) && (pVar1 != PIXEL_FMT_DXT5_xGBR)) goto LAB_00131a0f;
      }
      else if ((int)pVar1 < 0x53413245) {
        if (pVar1 != PIXEL_FMT_DXT5_xGxR) {
          if (pVar1 != PIXEL_FMT_ETC1S) goto LAB_00131a0f;
          goto LAB_00131675;
        }
      }
      else {
        if (pVar1 == PIXEL_FMT_ETC2AS) {
LAB_00131612:
          ogl_internal_fmt = 0x9278;
          goto LAB_0013168f;
        }
        if (pVar1 == PIXEL_FMT_DXN) goto LAB_00131683;
        if (pVar1 != PIXEL_FMT_DXT5_CCxY) goto LAB_00131a0f;
      }
LAB_0013167c:
      ogl_internal_fmt = 0x83f3;
    }
LAB_0013168f:
    ogl_fmt = 0;
  }
  ktx_texture::ktx_texture(&local_a0);
  tVar8 = determine_texture_type(this);
  if (tVar8 == cTextureTypeCubemap) {
    if ((this->m_faces).m_size == 0) {
      uVar16 = 0;
    }
    else {
      uVar16 = ((this->m_faces).m_p)->m_size;
    }
    bVar7 = ktx_texture::init_cubemap
                      (&local_a0,this->m_width,uVar16,ogl_internal_fmt,ogl_fmt,ogl_type);
  }
  else {
    if ((this->m_faces).m_size == 0) {
      uVar16 = 0;
    }
    else {
      uVar16 = ((this->m_faces).m_p)->m_size;
    }
    bVar7 = ktx_texture::init_2D
                      (&local_a0,this->m_width,this->m_height,uVar16,ogl_internal_fmt,ogl_fmt,
                       ogl_type);
  }
  if (bVar7 == false) {
    uVar9 = 0;
  }
  else {
    pVar1 = this->m_format;
    dynamic_string::dynamic_string
              (&local_f8,cVarArg,"%c%c%c%c",(ulong)(pVar1 & 0xff),(ulong)(pVar1 >> 8 & 0xff),
               (ulong)(pVar1 >> 0x10 & 0xff),pVar1 >> 0x18);
    pcVar18 = local_f8.m_pStr;
    if (local_f8.m_pStr == (char *)0x0) {
      pcVar18 = "";
    }
    sVar10 = strlen(pcVar18);
    ktx_texture::add_key_value(&local_a0,"CRNLIB_FOURCC",pcVar18,(int)sVar10 + 1);
    uVar12 = 0x6c;
    if (((*((this->m_faces).m_p)->m_p)->m_orient_flags & cOrientationFlagXFlipped) ==
        cDefaultOrientationFlags) {
      uVar12 = 0x72;
    }
    dynamic_string::dynamic_string(&local_108,cVarArg,"S=%c,T=%c",uVar12);
    pcVar18 = "";
    if (local_108.m_pStr != (char *)0x0) {
      pcVar18 = local_108.m_pStr;
    }
    sVar10 = strlen(pcVar18);
    ktx_texture::add_key_value(&local_a0,"KTXorientation",pcVar18,(int)sVar10 + 1);
    uVar9 = (this->m_faces).m_size;
    if (uVar9 != 0) {
      uVar15 = 0;
      do {
        local_110 = uVar15 << 4;
        uVar19 = 0;
        uVar11 = 1;
        local_118 = uVar15;
        while( true ) {
          if (uVar11 == 0) {
            uVar13 = 0;
          }
          else {
            uVar13 = (ulong)((this->m_faces).m_p)->m_size;
          }
          if (uVar13 <= uVar19) break;
          pvVar4 = (this->m_faces).m_p;
          piVar5 = *(int **)(*(long *)((long)&pvVar4->m_p + local_110) + uVar19 * 8);
          iVar2 = *piVar5;
          iVar3 = piVar5[1];
          local_130 = uVar19;
          if ((uVar11 == 0) || ((*pvVar4->m_p)->m_pDXTImage == (dxt_image *)0x0)) {
            lVar6 = *(long *)(piVar5 + 4);
            uVar16 = iVar3 * iVar2 * local_e8.m_pixel_stride;
            local_148.m_p = (void *)0x0;
            local_148.m_size = 0;
            local_148.m_capacity = 0;
            if (uVar16 != 0) {
              elemental_vector::increase_capacity
                        (&local_148,uVar16,uVar16 == 1,1,(object_mover)0x0,false);
              memset((void *)((local_148._8_8_ & 0xffffffff) + (long)local_148.m_p),0,
                     (ulong)(uVar16 - local_148.m_size));
              local_148.m_size = uVar16;
            }
            if (iVar3 != 0) {
              iVar17 = 0;
              p = local_148.m_p;
              do {
                if (iVar2 != 0) {
                  iVar14 = 0;
                  do {
                    p = pixel_packer::pack<crnlib::color_quad<unsigned_char,int>>
                                  (&local_e8,
                                   (color_quad<unsigned_char,_int> *)
                                   ((ulong)(uint)(*(int *)(lVar6 + 8) * iVar17 + iVar14) * 4 +
                                   *(long *)(lVar6 + 0x18)),p,true);
                    iVar14 = iVar14 + 1;
                  } while (iVar2 != iVar14);
                }
                iVar17 = iVar17 + 1;
              } while (iVar17 != iVar3);
              uVar16 = local_148.m_size;
            }
            uVar15 = local_118;
            uVar19 = local_130;
            ktx_texture::add_image(&local_a0,(uint)local_118,(uint)local_130,local_148.m_p,uVar16);
            if (local_148.m_p != (void *)0x0) {
              crnlib_free(local_148.m_p);
            }
          }
          else {
            ktx_texture::add_image
                      (&local_a0,(uint)uVar15,(uint)uVar19,*(void **)(*(long *)(piVar5 + 6) + 0x10),
                       *(int *)(*(long *)(piVar5 + 6) + 8) << 3);
          }
          uVar19 = uVar19 + 1;
          uVar9 = (this->m_faces).m_size;
          uVar11 = uVar9;
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 < uVar9);
    }
    bVar7 = ktx_texture::write_to_stream(&local_a0,local_120,false);
    uVar9 = (uint)bVar7;
    if (bVar7) {
      dynamic_string::clear(local_128);
    }
    if ((local_108.m_pStr != (char *)0x0) &&
       ((*(uint *)(local_108.m_pStr + -8) ^ *(uint *)(local_108.m_pStr + -4)) == 0xffffffff)) {
      crnlib_free(local_108.m_pStr + -0x10);
    }
    if ((local_f8.m_pStr != (char *)0x0) &&
       ((*(uint *)(local_f8.m_pStr + -8) ^ *(uint *)(local_f8.m_pStr + -4)) == 0xffffffff)) {
      crnlib_free(local_f8.m_pStr + -0x10);
    }
  }
  ktx_texture::~ktx_texture(&local_a0);
LAB_00131a0f:
  return SUB41(uVar9,0);
}

Assistant:

bool mipmapped_texture::write_ktx(data_stream_serializer& serializer) const {
  if (!m_width) {
    set_last_error("Nothing to write");
    return false;
  }

  set_last_error("write_ktx() failed");

  uint32 ogl_internal_fmt = 0, ogl_fmt = 0, ogl_type = 0;

  pixel_packer packer;

  if (is_packed()) {
    switch (get_format()) {
      case PIXEL_FMT_DXT1: {
        ogl_internal_fmt = KTX_COMPRESSED_RGB_S3TC_DXT1_EXT;
        break;
      }
      case PIXEL_FMT_DXT1A: {
        ogl_internal_fmt = KTX_COMPRESSED_RGBA_S3TC_DXT1_EXT;
        break;
      }
      case PIXEL_FMT_DXT2:
      case PIXEL_FMT_DXT3: {
        ogl_internal_fmt = KTX_COMPRESSED_RGBA_S3TC_DXT3_EXT;
        break;
      }
      case PIXEL_FMT_DXT4:
      case PIXEL_FMT_DXT5:
      case PIXEL_FMT_DXT5_CCxY:
      case PIXEL_FMT_DXT5_xGxR:
      case PIXEL_FMT_DXT5_xGBR:
      case PIXEL_FMT_DXT5_AGBR: {
        ogl_internal_fmt = KTX_COMPRESSED_RGBA_S3TC_DXT5_EXT;
        break;
      }
      case PIXEL_FMT_3DC:
      case PIXEL_FMT_DXN: {
        ogl_internal_fmt = KTX_COMPRESSED_SIGNED_RED_GREEN_RGTC2_EXT;
        break;
      }
      case PIXEL_FMT_DXT5A: {
        ogl_internal_fmt = KTX_COMPRESSED_LUMINANCE_LATC1_EXT;
        break;
      }
      case PIXEL_FMT_ETC1:
      case PIXEL_FMT_ETC1S: {
        ogl_internal_fmt = KTX_ETC1_RGB8_OES;
        break;
      }
      case PIXEL_FMT_ETC2: {
        ogl_internal_fmt = KTX_COMPRESSED_RGB8_ETC2;
        break;
      }
      case PIXEL_FMT_ETC2A:
      case PIXEL_FMT_ETC2AS: {
        ogl_internal_fmt = KTX_COMPRESSED_RGBA8_ETC2_EAC;
        break;
      }
      default: {
        CRNLIB_ASSERT(0);
        return false;
      }
    }
  } else {
    ogl_type = KTX_UNSIGNED_BYTE;

    switch (get_format()) {
      case PIXEL_FMT_R8G8B8:
        ogl_internal_fmt = KTX_RGB8;
        ogl_fmt = KTX_RGB;
        packer.init("R8G8B8");
        break;
      case PIXEL_FMT_L8:
        ogl_internal_fmt = KTX_LUMINANCE8;
        ogl_fmt = KTX_LUMINANCE;
        packer.init("G8");
        break;
      case PIXEL_FMT_A8:
        ogl_internal_fmt = KTX_ALPHA8;
        ogl_fmt = KTX_ALPHA;
        packer.init("A8");
        break;
      case PIXEL_FMT_A8L8:
        ogl_internal_fmt = KTX_LUMINANCE8_ALPHA8;
        ogl_fmt = KTX_LUMINANCE_ALPHA;
        packer.init("Y8A8");
        break;
      case PIXEL_FMT_A8R8G8B8:
        ogl_internal_fmt = KTX_RGBA8;
        ogl_fmt = KTX_RGBA;
        packer.init("R8G8B8A8");
        break;
      default: {
        CRNLIB_ASSERT(0);
        return false;
      }
    }
  }

  ktx_texture kt;
  bool success;
  if (determine_texture_type() == cTextureTypeCubemap)
    success = kt.init_cubemap(get_width(), get_num_levels(), ogl_internal_fmt, ogl_fmt, ogl_type);
  else
    success = kt.init_2D(get_width(), get_height(), get_num_levels(), ogl_internal_fmt, ogl_fmt, ogl_type);
  if (!success)
    return false;

  dynamic_string fourcc_str(cVarArg, "%c%c%c%c", m_format & 0xFF, (m_format >> 8) & 0xFF, (m_format >> 16) & 0xFF, (m_format >> 24) & 0xFF);
  kt.add_key_value("CRNLIB_FOURCC", fourcc_str.get_ptr());

  const mip_level* pLevel0 = get_level(0, 0);
  dynamic_string ktx_orient_str(cVarArg, "S=%c,T=%c", (pLevel0->get_orientation_flags() & cOrientationFlagXFlipped) ? 'l' : 'r', (pLevel0->get_orientation_flags() & cOrientationFlagYFlipped) ? 'u' : 'd');
  kt.add_key_value("KTXorientation", ktx_orient_str.get_ptr());

  for (uint face_index = 0; face_index < get_num_faces(); face_index++) {
    for (uint level_index = 0; level_index < get_num_levels(); level_index++) {
      const mip_level* pLevel = get_level(face_index, level_index);

      const uint mip_width = pLevel->get_width();
      const uint mip_height = pLevel->get_height();

      if (is_packed()) {
        const dxt_image* p = pLevel->get_dxt_image();

        kt.add_image(face_index, level_index, p->get_element_ptr(), p->get_size_in_bytes());
      } else {
        const image_u8* p = pLevel->get_image();

        crnlib::vector<uint8> tmp(mip_width * mip_height * packer.get_pixel_stride());

        uint8* pDst = tmp.get_ptr();
        for (uint y = 0; y < mip_height; y++)
          for (uint x = 0; x < mip_width; x++)
            pDst = (uint8*)packer.pack(p->get_unclamped(x, y), pDst);

        kt.add_image(face_index, level_index, tmp.get_ptr(), tmp.size_in_bytes());
      }
    }
  }

  if (!kt.write_to_stream(serializer))
    return false;

  clear_last_error();
  return true;
}